

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparationPart.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::SeparationPart::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SeparationPart *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  SeparationPart *local_18;
  SeparationPart *this_local;
  
  local_18 = this;
  this_local = (SeparationPart *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Separation Part:");
  poVar1 = std::operator<<(poVar1,"\n Reason for Separation: ");
  ENUMS::GetEnumAsStringReasonForSeparation_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)this->m_ui8Reason,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tPre-Entity Indicator:  ");
  ENUMS::GetEnumAsStringPreEntityIndicator_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)this->m_ui8PreEntIndicator,Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\n\tParent Entity Id:      ");
  EntityIdentifier::GetAsString_abi_cxx11_(&local_210,&this->m_ParentEntId);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"\n\tStation Location:      ");
  NamedLocationIdentifier::GetAsString_abi_cxx11_(&local_230,&this->m_StationLoc);
  std::operator<<(poVar1,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString SeparationPart::GetAsString() const
{
    KStringStream ss;

    ss << "Separation Part:"
       << "\n Reason for Separation: " << GetEnumAsStringReasonForSeparation(m_ui8Reason)
       << "\n\tPre-Entity Indicator:  " << GetEnumAsStringPreEntityIndicator( m_ui8PreEntIndicator )
       << "\n\tParent Entity Id:      " << m_ParentEntId.GetAsString()
       << "\n\tStation Location:      " << m_StationLoc.GetAsString();

    return ss.str();
}